

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkNullableIndex(CheckerVisitor *this,GetSlotExpr *expr)

{
  bool bVar1;
  GetSlotExpr *pGVar2;
  
  if (this->effectsOnly == false) {
    pGVar2 = expr;
    do {
      if ((pGVar2->super_SlotAccessExpr).super_AccessExpr._nullable != false) {
        return;
      }
      pGVar2 = (GetSlotExpr *)(pGVar2->super_SlotAccessExpr).super_AccessExpr._receiver;
    } while ((pGVar2->super_SlotAccessExpr).super_AccessExpr.super_Expr.super_Node._op - TO_GETFIELD
             < 4);
    bVar1 = isPotentiallyNullable(this,(expr->super_SlotAccessExpr)._key);
    if (bVar1) {
      report(this,&((expr->super_SlotAccessExpr)._key)->super_Node,0x41);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkNullableIndex(const GetSlotExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *key = expr->key();

  if (!isSafeAccess(expr) && isPotentiallyNullable(key)) {
    report(expr->key(), DiagnosticsId::DI_POTENTIALLY_NULLABLE_INDEX);
  }
}